

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vic20.cpp
# Opt level: O1

bool __thiscall Commodore::Vic20::ConcreteMachine::insert_media(ConcreteMachine *this,Media *media)

{
  ushort uVar1;
  ushort uVar2;
  pointer psVar3;
  element_type *this_00;
  pointer psVar4;
  Machine *this_01;
  pointer psVar5;
  void *pvVar6;
  bool bVar7;
  pointer puVar8;
  long lVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rom_image;
  shared_ptr<Storage::Disk::Disk> local_58;
  shared_ptr<Storage::Tape::Tape> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  psVar3 = (media->tapes).
           super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar3 != (media->tapes).
                super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (this->tape_).
              super___shared_ptr<Storage::Tape::BinaryTapePlayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar3->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (psVar3->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Storage::Tape::TapePlayer::set_tape(&this_00->super_TapePlayer,&local_48);
    if (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  psVar4 = (media->disks).
           super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((psVar4 != (media->disks).
                 super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
     (this_01 = (this->c1540_).
                super___shared_ptr<Commodore::C1540::Machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     this_01 != (Machine *)0x0)) {
    local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar4->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (psVar4->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    C1540::Machine::set_disk(this_01,&local_58);
    if (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  psVar5 = (media->cartridges).
           super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar5 != (media->cartridges).
                super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    this->rom_address_ = 0xa000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_38,
               &((((psVar5->
                   super___shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->segments_).
                 super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->data);
    this->rom_length_ =
         (short)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (short)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->rom_,&local_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->rom_,0x2000);
    uVar1 = this->rom_length_;
    if (0x3ff < uVar1) {
      uVar2 = this->rom_address_;
      puVar8 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        this->processor_read_memory_map_[(ulong)(uVar2 >> 10) + lVar9] = puVar8;
        puVar8 = puVar8 + 0x400;
        lVar9 = lVar9 + 1;
      } while (uVar1 >> 10 != (ushort)lVar9);
    }
    pvVar6 = (void *)CONCAT44(local_38.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_38.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,(long)local_38.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar6
                     );
    }
  }
  if ((this->tape_is_sleeping_ == false) && (this->allow_fast_tape_hack_ == true)) {
    bVar7 = Storage::Tape::TapePlayer::has_tape
                      (&((this->tape_).
                         super___shared_ptr<Storage::Tape::BinaryTapePlayer,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super_TapePlayer);
  }
  else {
    bVar7 = false;
  }
  this->use_fast_tape_hack_ = bVar7;
  bVar7 = true;
  if (((media->tapes).
       super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (media->tapes).
       super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (((media->disks).
       super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (media->disks).
       super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ||
      ((this->c1540_).super___shared_ptr<Commodore::C1540::Machine,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr == (element_type *)0x0)))) {
    bVar7 = (media->cartridges).
            super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (media->cartridges).
            super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  return bVar7;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(!media.tapes.empty()) {
				tape_->set_tape(media.tapes.front());
			}

			if(!media.disks.empty() && c1540_) {
				c1540_->set_disk(media.disks.front());
			}

			if(!media.cartridges.empty()) {
				rom_address_ = 0xa000;
				std::vector<uint8_t> rom_image = media.cartridges.front()->get_segments().front().data;
				rom_length_ = uint16_t(rom_image.size());

				rom_ = rom_image;
				rom_.resize(0x2000);
				write_to_map(processor_read_memory_map_, rom_.data(), rom_address_, rom_length_);
			}

			set_use_fast_tape();

			return !media.tapes.empty() || (!media.disks.empty() && c1540_ != nullptr) || !media.cartridges.empty();
		}